

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat * __thiscall Mat::resize(Mat *__return_storage_ptr__,Mat *this,int a,int b)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int j;
  int iVar6;
  int i;
  uint uVar7;
  undefined8 *puVar8;
  pointer p_Var9;
  long lVar10;
  ulong uVar11;
  vector<__int128,_std::allocator<__int128>_> temp;
  ll128 *local_58 [2];
  _Vector_base<__int128,_std::allocator<__int128>_> local_48;
  
  uVar3 = (ulong)(uint)b;
  Mat(__return_storage_ptr__,a,b);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar7 = 0; (int)uVar7 < this->r; uVar7 = uVar7 + 1) {
    for (iVar6 = 0; iVar6 < this->c; iVar6 = iVar6 + 1) {
      local_58[0] = get((ll128 *)this,(Mat *)(ulong)uVar7,iVar6,(int)uVar3);
      std::vector<__int128,_std::allocator<__int128>_>::emplace_back<__int128>
                ((vector<__int128,_std::allocator<__int128>_> *)&local_48,(__int128 *)local_58);
    }
  }
  uVar2 = 0;
  uVar3 = (ulong)(uint)b;
  if (b < 1) {
    uVar3 = uVar2;
  }
  uVar11 = (ulong)(uint)a;
  if (a < 1) {
    uVar11 = uVar2;
  }
  lVar5 = 0;
  for (uVar4 = 0; uVar4 != uVar11; uVar4 = uVar4 + 1) {
    iVar6 = __return_storage_ptr__->r;
    puVar8 = (undefined8 *)
             ((long)(__return_storage_ptr__->val).
                    super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar2);
    p_Var9 = local_48._M_impl.super__Vector_impl_data._M_start + (int)lVar5;
    for (lVar10 = 0; -lVar10 != uVar3; lVar10 = lVar10 + -1) {
      uVar1 = *(undefined8 *)((long)p_Var9 + 8);
      *puVar8 = (long)*p_Var9;
      puVar8[1] = uVar1;
      puVar8 = puVar8 + (long)iVar6 * 2;
      p_Var9 = p_Var9 + 1;
    }
    uVar2 = uVar2 + 0x10;
    lVar5 = (int)lVar5 - lVar10;
  }
  std::_Vector_base<__int128,_std::allocator<__int128>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::resize(int a, int b) {
    Mat ret(a, b);
    vector<ll128> temp;
    for (int i = 0; i < r; i++)
        for (int j = 0; j < c; j++)
            temp.push_back(get(i, j));
    int l = 0;
    for (int i = 0; i < a; i++)
        for (int j = 0; j < b; j++) {
            ret(i, j) = temp[l++];
        }
    return ret;
}